

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

OptionDetails * __thiscall cxxopts::Options::operator[](Options *this,string *option)

{
  const_iterator cVar1;
  option_not_present_exception *this_00;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
          ::find(&(this->m_options)._M_t,option);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_options)._M_t._M_impl.super__Rb_tree_header) {
    return *(OptionDetails **)(cVar1._M_node + 2);
  }
  this_00 = (option_not_present_exception *)__cxa_allocate_exception(0x28);
  option_not_present_exception::option_not_present_exception(this_00,option);
  __cxa_throw(this_00,&option_not_present_exception::typeinfo,OptionException::~OptionException);
}

Assistant:

const OptionDetails&
    operator[](const std::string& option) const
    {
      auto iter = m_options.find(option);

      if (iter == m_options.end())
      {
        throw option_not_present_exception(option);
      }

      return *iter->second;
    }